

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_2_4_False(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int scale;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  float *data;
  ulong uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  float *pfVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  ulong uVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  float *pfVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  float *pfVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  undefined1 auVar87 [16];
  float fVar88;
  undefined1 auVar89 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  undefined1 auVar93 [64];
  int c2;
  int data_width;
  float *local_100;
  
  auVar62._8_4_ = 0x3effffff;
  auVar62._0_8_ = 0x3effffff3effffff;
  auVar62._12_4_ = 0x3effffff;
  auVar61._8_4_ = 0x80000000;
  auVar61._0_8_ = 0x8000000080000000;
  auVar61._12_4_ = 0x80000000;
  fVar68 = ipoint->scale;
  auVar93 = ZEXT464((uint)fVar68);
  auVar54 = vpternlogd_avx512vl(auVar62,ZEXT416((uint)fVar68),auVar61,0xf8);
  auVar54 = ZEXT416((uint)(fVar68 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  fVar67 = -0.08 / (fVar68 * fVar68);
  scale = (int)auVar54._0_4_;
  auVar55._0_4_ = (int)auVar54._0_4_;
  auVar55._4_4_ = (int)auVar54._4_4_;
  auVar55._8_4_ = (int)auVar54._8_4_;
  auVar55._12_4_ = (int)auVar54._12_4_;
  auVar54 = vcvtdq2ps_avx(auVar55);
  auVar55 = vpternlogd_avx512vl(auVar62,ZEXT416((uint)ipoint->x),auVar61,0xf8);
  auVar55 = ZEXT416((uint)(ipoint->x + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56._0_8_ = (double)auVar55._0_4_;
  auVar56._8_8_ = auVar55._8_8_;
  auVar60._0_8_ = (double)fVar68;
  auVar60._8_8_ = 0;
  auVar55 = vfmadd231sd_fma(auVar56,auVar60,ZEXT816(0x3fe0000000000000));
  auVar59._0_4_ = (float)auVar55._0_8_;
  auVar59._4_12_ = auVar55._4_12_;
  auVar55 = vpternlogd_avx512vl(auVar62,ZEXT416((uint)ipoint->y),auVar61,0xf8);
  fVar5 = auVar59._0_4_ - auVar54._0_4_;
  auVar55 = ZEXT416((uint)(ipoint->y + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar57._0_8_ = (double)auVar55._0_4_;
  auVar57._8_8_ = auVar55._8_8_;
  auVar55 = vfmadd231sd_fma(auVar57,auVar60,ZEXT816(0x3fe0000000000000));
  auVar58._0_4_ = (float)auVar55._0_8_;
  auVar58._4_12_ = auVar55._4_12_;
  fVar92 = auVar58._0_4_ - auVar54._0_4_;
  auVar54 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar68),auVar59);
  auVar55 = vpternlogd_avx512vl(auVar62,auVar54,auVar61,0xf8);
  auVar54 = ZEXT416((uint)(auVar54._0_4_ + auVar55._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = ZEXT416((uint)fVar68);
  if (scale < (int)auVar54._0_4_) {
    auVar63._8_4_ = 0x3effffff;
    auVar63._0_8_ = 0x3effffff3effffff;
    auVar63._12_4_ = 0x3effffff;
    auVar64._8_4_ = 0x80000000;
    auVar64._0_8_ = 0x8000000080000000;
    auVar64._12_4_ = 0x80000000;
    auVar54 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar55,auVar58);
    auVar56 = vpternlogd_avx512vl(auVar64,auVar54,auVar63,0xea);
    auVar54 = ZEXT416((uint)(auVar54._0_4_ + auVar56._0_4_));
    auVar54 = vroundss_avx(auVar54,auVar54,0xb);
    if (scale < (int)auVar54._0_4_) {
      auVar54 = vfmadd231ss_fma(auVar59,auVar55,ZEXT416(0x41300000));
      auVar65._8_4_ = 0x80000000;
      auVar65._0_8_ = 0x8000000080000000;
      auVar65._12_4_ = 0x80000000;
      auVar56 = vpternlogd_avx512vl(auVar65,auVar54,auVar63,0xea);
      auVar54 = ZEXT416((uint)(auVar54._0_4_ + auVar56._0_4_));
      auVar54 = vroundss_avx(auVar54,auVar54,0xb);
      if ((int)auVar54._0_4_ + scale <= iimage->width) {
        auVar54 = vfmadd231ss_fma(auVar58,auVar55,ZEXT416(0x41300000));
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar56 = vpternlogd_avx512vl(auVar63,auVar54,auVar14,0xf8);
        auVar54 = ZEXT416((uint)(auVar54._0_4_ + auVar56._0_4_));
        auVar54 = vroundss_avx(auVar54,auVar54,0xb);
        if ((int)auVar54._0_4_ + scale <= iimage->height) {
          iVar2 = iimage->data_width;
          pfVar39 = iimage->data;
          fVar5 = fVar5 + 0.5;
          local_100 = haarResponseY + 0x1b;
          pfVar53 = haarResponseX + 0x1b;
          iVar25 = scale * 2;
          uVar19 = 0xfffffff4;
          do {
            auVar54._0_4_ = (float)(int)uVar19;
            auVar54._4_12_ = in_ZMM8._4_12_;
            auVar85._0_4_ = (float)(int)(uVar19 | 1);
            auVar85._4_12_ = in_ZMM8._4_12_;
            auVar54 = vfmadd213ss_fma(auVar54,auVar55,ZEXT416((uint)(fVar92 + 0.5)));
            auVar56 = vfmadd213ss_fma(auVar85,auVar55,ZEXT416((uint)(fVar92 + 0.5)));
            iVar16 = (int)auVar54._0_4_;
            iVar18 = (int)auVar56._0_4_;
            iVar27 = (iVar16 + -1) * iVar2;
            iVar17 = (iVar16 + -1 + scale) * iVar2;
            iVar22 = (iVar16 + -1 + iVar25) * iVar2;
            iVar16 = (iVar18 + -1 + scale) * iVar2;
            iVar28 = (iVar18 + -1) * iVar2;
            lVar51 = 0;
            iVar18 = (iVar18 + -1 + iVar25) * iVar2;
            do {
              iVar29 = (int)lVar51;
              auVar80._0_4_ = (float)(iVar29 + -0xc);
              auVar89 = auVar62._4_12_;
              auVar80._4_12_ = auVar89;
              auVar54 = vfmadd213ss_fma(auVar80,auVar55,ZEXT416((uint)fVar5));
              iVar35 = (int)auVar54._0_4_;
              auVar81._0_4_ = (float)(iVar29 + -0xb);
              auVar81._4_12_ = auVar89;
              auVar54 = vfmadd213ss_fma(auVar81,auVar55,ZEXT416((uint)fVar5));
              iVar33 = iVar35 + -1 + iVar25;
              iVar36 = (int)auVar54._0_4_;
              auVar82._0_4_ = (float)(iVar29 + -10);
              auVar82._4_12_ = auVar89;
              auVar54 = vfmadd213ss_fma(auVar82,auVar55,ZEXT416((uint)fVar5));
              iVar46 = iVar36 + -1 + iVar25;
              iVar30 = (int)auVar54._0_4_;
              auVar83._0_4_ = (float)(iVar29 + -9);
              auVar83._4_12_ = auVar89;
              auVar54 = vfmadd213ss_fma(auVar83,auVar55,ZEXT416((uint)fVar5));
              iVar31 = (int)auVar54._0_4_;
              iVar38 = iVar35 + -1 + scale;
              fVar68 = pfVar39[iVar22 + -1 + iVar35];
              fVar71 = pfVar39[iVar27 + iVar33];
              auVar57 = SUB6416(ZEXT464(0x40000000),0);
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar27 + iVar38] -
                                                      pfVar39[iVar22 + iVar38])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar22 + iVar33] -
                                                      pfVar39[iVar27 + -1 + iVar35])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar17 + -1 + iVar35] -
                                                      pfVar39[iVar17 + iVar33])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar22 + iVar33] -
                                                      pfVar39[iVar27 + -1 + iVar35])));
              pfVar53[lVar51 + -0x1b] = (fVar68 - fVar71) + auVar54._0_4_;
              local_100[lVar51 + -0x1b] = auVar56._0_4_ - (fVar68 - fVar71);
              iVar48 = iVar36 + -1 + scale;
              fVar68 = pfVar39[iVar22 + -1 + iVar36];
              fVar71 = pfVar39[iVar27 + iVar46];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar17 + -1 + iVar36] -
                                                      pfVar39[iVar17 + iVar46])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar22 + iVar46] -
                                                      pfVar39[iVar27 + -1 + iVar36])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar27 + iVar48] -
                                                      pfVar39[iVar22 + iVar48])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar22 + iVar46] -
                                                      pfVar39[iVar27 + -1 + iVar36])));
              pfVar53[lVar51 + -0x1a] = (fVar68 - fVar71) + auVar56._0_4_;
              local_100[lVar51 + -0x1a] = auVar54._0_4_ - (fVar68 - fVar71);
              iVar32 = iVar30 + -1 + iVar25;
              iVar34 = iVar30 + -1 + scale;
              fVar68 = pfVar39[iVar22 + -1 + iVar30];
              fVar71 = pfVar39[iVar27 + iVar32];
              iVar45 = iVar31 + -1 + iVar25;
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar17 + -1 + iVar30] -
                                                      pfVar39[iVar17 + iVar32])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar22 + iVar32] -
                                                      pfVar39[iVar27 + -1 + iVar30])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar27 + iVar34] -
                                                      pfVar39[iVar22 + iVar34])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar22 + iVar32] -
                                                      pfVar39[iVar27 + -1 + iVar30])));
              pfVar53[lVar51 + -0x19] = (fVar68 - fVar71) + auVar56._0_4_;
              iVar42 = iVar31 + -1 + scale;
              local_100[lVar51 + -0x19] = auVar54._0_4_ - (fVar68 - fVar71);
              fVar68 = pfVar39[iVar22 + -1 + iVar31];
              fVar71 = pfVar39[iVar27 + iVar45];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar27 + iVar42] -
                                                      pfVar39[iVar22 + iVar42])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar22 + iVar45] -
                                                      pfVar39[iVar27 + -1 + iVar31])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar17 + -1 + iVar31] -
                                                      pfVar39[iVar17 + iVar45])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar22 + iVar45] -
                                                      pfVar39[iVar27 + -1 + iVar31])));
              pfVar53[lVar51 + -0x18] = (fVar68 - fVar71) + auVar54._0_4_;
              local_100[lVar51 + -0x18] = auVar56._0_4_ - (fVar68 - fVar71);
              fVar68 = pfVar39[iVar18 + -1 + iVar35];
              fVar71 = pfVar39[iVar28 + iVar33];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar16 + -1 + iVar35] -
                                                      pfVar39[iVar16 + iVar33])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar33 + iVar18] -
                                                      pfVar39[iVar28 + -1 + iVar35])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar28 + iVar38] -
                                                      pfVar39[iVar38 + iVar18])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar33 + iVar18] -
                                                      pfVar39[iVar28 + -1 + iVar35])));
              pfVar53[lVar51 + -3] = (fVar68 - fVar71) + auVar56._0_4_;
              local_100[lVar51 + -3] = auVar54._0_4_ - (fVar68 - fVar71);
              fVar68 = pfVar39[iVar18 + -1 + iVar36];
              fVar71 = pfVar39[iVar28 + iVar46];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar28 + iVar48] -
                                                      pfVar39[iVar48 + iVar18])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar46 + iVar18] -
                                                      pfVar39[iVar28 + -1 + iVar36])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar16 + -1 + iVar36] -
                                                      pfVar39[iVar16 + iVar46])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar46 + iVar18] -
                                                      pfVar39[iVar28 + -1 + iVar36])));
              pfVar53[lVar51 + -2] = (fVar68 - fVar71) + auVar54._0_4_;
              local_100[lVar51 + -2] = auVar56._0_4_ - (fVar68 - fVar71);
              fVar68 = pfVar39[iVar18 + -1 + iVar30];
              fVar71 = pfVar39[iVar28 + iVar32];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar28 + iVar34] -
                                                      pfVar39[iVar34 + iVar18])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar32 + iVar18] -
                                                      pfVar39[iVar28 + -1 + iVar30])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar16 + -1 + iVar30] -
                                                      pfVar39[iVar16 + iVar32])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar32 + iVar18] -
                                                      pfVar39[iVar28 + -1 + iVar30])));
              pfVar53[lVar51 + -1] = (fVar68 - fVar71) + auVar54._0_4_;
              local_100[lVar51 + -1] = auVar56._0_4_ - (fVar68 - fVar71);
              fVar68 = pfVar39[iVar18 + -1 + iVar31];
              fVar71 = pfVar39[iVar28 + iVar45];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar28 + iVar42] -
                                                      pfVar39[iVar42 + iVar18])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar45 + iVar18] -
                                                      pfVar39[iVar28 + -1 + iVar31])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar39[iVar16 + -1 + iVar31] -
                                                      pfVar39[iVar16 + iVar45])),auVar57,
                                        ZEXT416((uint)(pfVar39[iVar45 + iVar18] -
                                                      pfVar39[iVar28 + -1 + iVar31])));
              pfVar53[lVar51] = (fVar68 - fVar71) + auVar54._0_4_;
              local_100[lVar51] = auVar56._0_4_ - (fVar68 - fVar71);
              lVar51 = lVar51 + 4;
            } while (iVar29 + -0xc < 8);
            local_100 = local_100 + 0x30;
            pfVar53 = pfVar53 + 0x30;
            bVar4 = (int)uVar19 < 10;
            uVar19 = uVar19 + 2;
          } while (bVar4);
          goto LAB_001b7cff;
        }
      }
    }
  }
  lVar51 = 0;
  iVar2 = scale * 2;
  uVar19 = 0xfffffff4;
  do {
    auVar69._0_4_ = (float)(int)uVar19;
    auVar69._4_12_ = in_ZMM8._4_12_;
    auVar72._0_4_ = (float)(int)(uVar19 | 1);
    auVar72._4_12_ = in_ZMM8._4_12_;
    auVar54 = vfmadd213ss_fma(auVar69,auVar93._0_16_,ZEXT416((uint)fVar92));
    auVar56 = vfmadd213ss_fma(auVar72,auVar93._0_16_,ZEXT416((uint)fVar92));
    fVar68 = auVar54._0_4_;
    fVar71 = auVar56._0_4_;
    iVar48 = (int)((double)((ulong)(0.0 <= fVar68) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar68) * -0x4020000000000000) + (double)fVar68);
    iVar27 = iVar48 + -1;
    iVar17 = iVar2 + iVar48;
    iVar22 = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
    iVar28 = iVar48 + -1 + scale;
    iVar18 = iVar22 + -1 + scale;
    iVar29 = iVar2 + -1 + iVar48;
    iVar30 = iVar2 + iVar22;
    iVar16 = iVar2 + -1 + iVar22;
    iVar31 = iVar22 + -1;
    pfVar39 = haarResponseX;
    pfVar53 = haarResponseY;
    lVar50 = lVar51;
    iVar25 = -0xc;
    do {
      auVar70._0_4_ = (float)iVar25;
      auVar89 = in_ZMM8._4_12_;
      auVar70._4_12_ = auVar89;
      auVar57 = auVar93._0_16_;
      auVar54 = vfmadd213ss_fma(auVar70,auVar57,ZEXT416((uint)fVar5));
      auVar87._0_4_ = (float)(iVar25 + 1);
      auVar87._4_12_ = auVar89;
      auVar78._0_4_ = (float)(iVar25 + 2);
      auVar78._4_12_ = auVar89;
      auVar75._0_4_ = (float)(iVar25 + 3);
      auVar75._4_12_ = auVar89;
      auVar56 = vfmadd213ss_fma(auVar87,auVar57,ZEXT416((uint)fVar5));
      fVar86 = auVar56._0_4_;
      auVar56 = vfmadd213ss_fma(auVar78,auVar57,ZEXT416((uint)fVar5));
      auVar57 = vfmadd213ss_fma(auVar75,auVar57,ZEXT416((uint)fVar5));
      fVar68 = auVar54._0_4_;
      fVar71 = auVar57._0_4_;
      fVar77 = auVar56._0_4_;
      iVar42 = (int)((double)((ulong)(0.0 <= fVar68) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar68) * -0x4020000000000000) + (double)fVar68);
      if (((iVar48 < 1) || (iVar42 < 1)) || (iimage->height < iVar17)) {
LAB_001b728c:
        haarXY(iimage,iVar48,iVar42,scale,(float *)((long)pfVar39 + lVar50),
               (float *)((long)pfVar53 + lVar50));
        iVar38 = iimage->width;
        pfVar39 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar38 = iimage->width;
        iVar33 = iVar2 + iVar42;
        if (iVar38 < iVar33) goto LAB_001b728c;
        iVar35 = iVar42 + -1 + scale;
        iVar34 = iimage->data_width;
        pfVar47 = iimage->data;
        iVar32 = iVar34 * iVar27;
        iVar36 = iVar34 * iVar29;
        fVar68 = pfVar47[iVar36 + -1 + iVar42];
        fVar6 = pfVar47[iVar32 + -1 + iVar33];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar32 + iVar35] - pfVar47[iVar36 + iVar35]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar47[iVar36 + -1 + iVar33] -
                                                pfVar47[iVar32 + -1 + iVar42])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar34 * iVar28 + -1 + iVar42] -
                                                pfVar47[iVar34 * iVar28 + -1 + iVar33])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar47[iVar36 + -1 + iVar33] -
                                                pfVar47[iVar32 + -1 + iVar42])));
        *(float *)((long)pfVar39 + lVar50) = (fVar68 - fVar6) + auVar54._0_4_;
        *(float *)((long)pfVar53 + lVar50) = auVar56._0_4_ - (fVar68 - fVar6);
      }
      pfVar47 = (float *)((long)pfVar39 + lVar50 + 4);
      pfVar1 = (float *)((long)pfVar53 + lVar50 + 4);
      iVar33 = (int)((double)((ulong)(0.0 <= fVar86) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar86) * -0x4020000000000000) + (double)fVar86);
      if (((iVar48 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar17 || (iVar34 = iVar2 + iVar33, iVar38 < iVar34)))) {
        haarXY(iimage,iVar48,iVar33,scale,pfVar47,pfVar1);
        iVar38 = iimage->width;
        pfVar39 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar35 = iimage->data_width;
        iVar36 = iVar33 + -1 + scale;
        iVar32 = iVar35 * iVar27;
        pfVar3 = iimage->data;
        iVar46 = iVar35 * iVar29;
        fVar68 = pfVar3[iVar46 + -1 + iVar33];
        fVar86 = pfVar3[iVar32 + -1 + iVar34];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar32 + iVar36] - pfVar3[iVar46 + iVar36]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar34] -
                                                pfVar3[iVar32 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar35 * iVar28 + -1 + iVar33] -
                                                pfVar3[iVar35 * iVar28 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar34] -
                                                pfVar3[iVar32 + -1 + iVar33])));
        *pfVar47 = (fVar68 - fVar86) + auVar54._0_4_;
        *pfVar1 = auVar56._0_4_ - (fVar68 - fVar86);
      }
      pfVar47 = (float *)((long)pfVar39 + lVar50 + 8);
      pfVar1 = (float *)((long)pfVar53 + lVar50 + 8);
      iVar34 = (int)((double)((ulong)(0.0 <= fVar77) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar77) * -0x4020000000000000) + (double)fVar77);
      if (((iVar48 < 1) || (iVar34 < 1)) ||
         ((iimage->height < iVar17 || (iVar35 = iVar2 + iVar34, iVar38 < iVar35)))) {
        haarXY(iimage,iVar48,iVar34,scale,pfVar47,pfVar1);
        iVar38 = iimage->width;
        pfVar39 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar36 = iimage->data_width;
        iVar32 = iVar34 + -1 + scale;
        iVar46 = iVar36 * iVar27;
        pfVar3 = iimage->data;
        iVar45 = iVar36 * iVar29;
        fVar68 = pfVar3[iVar45 + -1 + iVar34];
        fVar77 = pfVar3[iVar46 + -1 + iVar35];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar32] - pfVar3[iVar45 + iVar32]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar35] -
                                                pfVar3[iVar46 + -1 + iVar34])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar36 * iVar28 + -1 + iVar34] -
                                                pfVar3[iVar36 * iVar28 + -1 + iVar35])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar35] -
                                                pfVar3[iVar46 + -1 + iVar34])));
        *pfVar47 = (fVar68 - fVar77) + auVar54._0_4_;
        *pfVar1 = auVar56._0_4_ - (fVar68 - fVar77);
      }
      pfVar47 = (float *)((long)pfVar39 + lVar50 + 0xc);
      pfVar1 = (float *)((long)pfVar53 + lVar50 + 0xc);
      iVar35 = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
      if ((((iVar48 < 1) || (iVar35 < 1)) || (iimage->height < iVar17)) ||
         (iVar36 = iVar2 + iVar35, iVar38 < iVar36)) {
        haarXY(iimage,iVar48,iVar35,scale,pfVar47,pfVar1);
        iVar38 = iimage->width;
        pfVar39 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar32 = iimage->data_width;
        iVar45 = iVar32 * iVar27;
        iVar44 = iVar35 + -1 + scale;
        pfVar3 = iimage->data;
        iVar46 = iVar32 * iVar29;
        fVar68 = pfVar3[iVar46 + -1 + iVar35];
        fVar71 = pfVar3[iVar45 + -1 + iVar36];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar45 + iVar44] - pfVar3[iVar46 + iVar44]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar36] -
                                                pfVar3[iVar45 + -1 + iVar35])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar32 * iVar28 + -1 + iVar35] -
                                                pfVar3[iVar32 * iVar28 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar36] -
                                                pfVar3[iVar45 + -1 + iVar35])));
        *pfVar47 = (fVar68 - fVar71) + auVar54._0_4_;
        *pfVar1 = auVar56._0_4_ - (fVar68 - fVar71);
      }
      pfVar47 = (float *)((long)pfVar39 + lVar50 + 0x60);
      pfVar1 = (float *)((long)pfVar53 + lVar50 + 0x60);
      if (((iVar22 < 1) || (iVar42 < 1)) ||
         ((iimage->height < iVar30 || (iVar36 = iVar2 + iVar42, iVar38 < iVar36)))) {
        haarXY(iimage,iVar22,iVar42,scale,pfVar47,pfVar1);
        iVar38 = iimage->width;
        pfVar39 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar32 = iimage->data_width;
        iVar46 = iVar32 * iVar31;
        iVar45 = iVar42 + -1 + scale;
        pfVar3 = iimage->data;
        iVar44 = iVar32 * iVar16;
        fVar68 = pfVar3[iVar44 + -1 + iVar42];
        fVar71 = pfVar3[iVar46 + -1 + iVar36];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar46 + iVar45] - pfVar3[iVar44 + iVar45]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar36] -
                                                pfVar3[iVar46 + -1 + iVar42])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar32 * iVar18 + -1 + iVar42] -
                                                pfVar3[iVar32 * iVar18 + -1 + iVar36])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar36] -
                                                pfVar3[iVar46 + -1 + iVar42])));
        *pfVar47 = (fVar68 - fVar71) + auVar54._0_4_;
        *pfVar1 = auVar56._0_4_ - (fVar68 - fVar71);
      }
      pfVar47 = (float *)((long)pfVar39 + lVar50 + 100);
      pfVar1 = (float *)((long)pfVar53 + lVar50 + 100);
      if (((iVar22 < 1) || (iVar33 < 1)) ||
         ((iimage->height < iVar30 || (iVar42 = iVar2 + iVar33, iVar38 < iVar42)))) {
        haarXY(iimage,iVar22,iVar33,scale,pfVar47,pfVar1);
        iVar38 = iimage->width;
        pfVar39 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar36 = iimage->data_width;
        iVar46 = iVar33 + -1 + scale;
        iVar32 = iVar36 * iVar31;
        pfVar3 = iimage->data;
        iVar45 = iVar36 * iVar16;
        fVar68 = pfVar3[iVar45 + -1 + iVar33];
        fVar71 = pfVar3[iVar32 + -1 + iVar42];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar32 + iVar46] - pfVar3[iVar45 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar42] -
                                                pfVar3[iVar32 + -1 + iVar33])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar36 * iVar18 + -1 + iVar33] -
                                                pfVar3[iVar36 * iVar18 + -1 + iVar42])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar42] -
                                                pfVar3[iVar32 + -1 + iVar33])));
        *pfVar47 = (fVar68 - fVar71) + auVar54._0_4_;
        *pfVar1 = auVar56._0_4_ - (fVar68 - fVar71);
      }
      pfVar47 = (float *)((long)pfVar39 + lVar50 + 0x68);
      pfVar1 = (float *)((long)pfVar53 + lVar50 + 0x68);
      if ((((iVar22 < 1) || (iVar34 < 1)) || (iimage->height < iVar30)) ||
         (iVar42 = iVar2 + iVar34, iVar38 < iVar42)) {
        haarXY(iimage,iVar22,iVar34,scale,pfVar47,pfVar1);
        iVar38 = iimage->width;
        pfVar39 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar33 = iimage->data_width;
        iVar32 = iVar34 + -1 + scale;
        iVar36 = iVar33 * iVar31;
        pfVar3 = iimage->data;
        iVar46 = iVar33 * iVar16;
        fVar68 = pfVar3[iVar46 + -1 + iVar34];
        fVar71 = pfVar3[iVar36 + -1 + iVar42];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar36 + iVar32] - pfVar3[iVar46 + iVar32]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar42] -
                                                pfVar3[iVar36 + -1 + iVar34])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar33 * iVar18 + -1 + iVar34] -
                                                pfVar3[iVar33 * iVar18 + -1 + iVar42])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar46 + -1 + iVar42] -
                                                pfVar3[iVar36 + -1 + iVar34])));
        *pfVar47 = (fVar68 - fVar71) + auVar54._0_4_;
        *pfVar1 = auVar56._0_4_ - (fVar68 - fVar71);
      }
      pfVar47 = (float *)((long)pfVar39 + lVar50 + 0x6c);
      pfVar1 = (float *)((long)pfVar53 + lVar50 + 0x6c);
      if (((iVar22 < 1) || (iVar35 < 1)) ||
         ((iimage->height < iVar30 || (iVar42 = iVar2 + iVar35, iVar38 < iVar42)))) {
        haarXY(iimage,iVar22,iVar35,scale,pfVar47,pfVar1);
        pfVar39 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar38 = iimage->data_width;
        iVar36 = iVar38 * iVar31;
        iVar33 = iVar35 + -1 + scale;
        pfVar3 = iimage->data;
        iVar34 = iVar38 * iVar16;
        fVar68 = pfVar3[iVar34 + -1 + iVar35];
        fVar71 = pfVar3[iVar36 + -1 + iVar42];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar36 + iVar33] - pfVar3[iVar34 + iVar33]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar34 + -1 + iVar42] -
                                                pfVar3[iVar36 + -1 + iVar35])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar38 * iVar18 + -1 + iVar35] -
                                                pfVar3[iVar38 * iVar18 + -1 + iVar42])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar34 + -1 + iVar42] -
                                                pfVar3[iVar36 + -1 + iVar35])));
        *pfVar47 = (fVar68 - fVar71) + auVar54._0_4_;
        *pfVar1 = auVar56._0_4_ - (fVar68 - fVar71);
      }
      auVar93 = ZEXT1664(auVar55);
      lVar50 = lVar50 + 0x10;
      bVar4 = iVar25 < 8;
      iVar25 = iVar25 + 4;
    } while (bVar4);
    lVar51 = lVar51 + 0xc0;
    bVar4 = (int)uVar19 < 10;
    uVar19 = uVar19 + 2;
  } while (bVar4);
LAB_001b7cff:
  fVar92 = auVar93._0_4_;
  auVar91._8_4_ = 0x3effffff;
  auVar91._0_8_ = 0x3effffff3effffff;
  auVar91._12_4_ = 0x3effffff;
  auVar90._8_4_ = 0x80000000;
  auVar90._0_8_ = 0x8000000080000000;
  auVar90._12_4_ = 0x80000000;
  auVar54 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 0.5)),auVar90,0xf8);
  auVar54 = ZEXT416((uint)(fVar92 * 0.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 1.5)),auVar90,0xf8);
  auVar55 = ZEXT416((uint)(fVar92 * 1.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 2.5)),auVar90,0xf8);
  auVar56 = ZEXT416((uint)(fVar92 * 2.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 3.5)),auVar90,0xf8);
  auVar57 = ZEXT416((uint)(fVar92 * 3.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 4.5)),auVar90,0xf8);
  auVar58 = ZEXT416((uint)(fVar92 * 4.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 5.5)),auVar90,0xf8);
  auVar59 = ZEXT416((uint)(fVar92 * 5.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 6.5)),auVar90,0xf8);
  auVar60 = ZEXT416((uint)(fVar92 * 6.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 7.5)),auVar90,0xf8);
  auVar61 = ZEXT416((uint)(auVar61._0_4_ + fVar92 * 7.5));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 8.5)),auVar90,0xf8);
  auVar62 = ZEXT416((uint)(fVar92 * 8.5 + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar63 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 9.5)),auVar90,0xf8);
  auVar63 = ZEXT416((uint)(fVar92 * 9.5 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 10.5)),auVar90,0xf8);
  auVar64 = ZEXT416((uint)(fVar92 * 10.5 + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar65 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)(fVar92 * 11.5)),auVar90,0xf8);
  fVar74 = auVar56._0_4_;
  fVar68 = fVar74 + auVar55._0_4_;
  fVar5 = fVar74 + auVar54._0_4_;
  auVar56 = ZEXT416((uint)(fVar92 * 11.5 + auVar65._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  fVar92 = fVar74 - auVar54._0_4_;
  fVar71 = fVar74 - auVar55._0_4_;
  fVar77 = fVar74 - auVar57._0_4_;
  fVar86 = fVar74 - auVar58._0_4_;
  fVar6 = fVar74 - auVar59._0_4_;
  fVar74 = fVar74 - auVar60._0_4_;
  fVar88 = auVar61._0_4_;
  fVar7 = fVar88 - auVar57._0_4_;
  fVar8 = fVar88 - auVar58._0_4_;
  fVar9 = fVar88 - auVar59._0_4_;
  fVar10 = fVar88 - auVar60._0_4_;
  fVar11 = fVar88 - auVar62._0_4_;
  fVar12 = fVar88 - auVar63._0_4_;
  fVar13 = fVar88 - auVar64._0_4_;
  fVar88 = fVar88 - auVar56._0_4_;
  gauss_s1_c0[0] = expf(fVar68 * fVar68 * fVar67);
  gauss_s1_c0[1] = expf(fVar5 * fVar5 * fVar67);
  gauss_s1_c0[2] = expf(fVar92 * fVar92 * fVar67);
  gauss_s1_c0[3] = expf(fVar71 * fVar71 * fVar67);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar77 * fVar77 * fVar67);
  gauss_s1_c0[6] = expf(fVar86 * fVar86 * fVar67);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar67);
  gauss_s1_c0[8] = expf(fVar74 * fVar74 * fVar67);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar67);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar67);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar67);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar67);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar67);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar67);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar67);
  gauss_s1_c1[8] = expf(fVar88 * fVar88 * fVar67);
  auVar73._8_4_ = 0x7fffffff;
  auVar73._0_8_ = 0x7fffffff7fffffff;
  auVar73._12_4_ = 0x7fffffff;
  uVar20 = 0xfffffff8;
  fVar68 = 0.0;
  lVar51 = 0;
  lVar50 = 0;
  local_100._0_4_ = 0;
  do {
    pfVar39 = gauss_s1_c1;
    uVar19 = (uint)uVar20;
    if (uVar19 != 7) {
      pfVar39 = gauss_s1_c0;
    }
    lVar49 = (long)(int)local_100;
    lVar50 = (long)(int)lVar50;
    if (uVar19 == 0xfffffff8) {
      pfVar39 = gauss_s1_c1;
    }
    uVar43 = 0;
    local_100._0_4_ = (int)local_100 + 4;
    uVar37 = 0xfffffff8;
    lVar40 = (long)haarResponseX + lVar51;
    lVar24 = (long)haarResponseY + lVar51;
    do {
      pfVar53 = gauss_s1_c1;
      if (uVar37 != 7) {
        pfVar53 = gauss_s1_c0;
      }
      auVar93 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar37 == 0xfffffff8) {
        pfVar53 = gauss_s1_c1;
      }
      uVar21 = (ulong)(uVar37 >> 0x1c & 0xfffffff8);
      uVar23 = uVar43;
      lVar26 = lVar24;
      lVar52 = lVar40;
      do {
        lVar41 = 0;
        pfVar47 = (float *)((long)pfVar39 + (ulong)(uint)((int)(uVar20 >> 0x1f) << 5));
        do {
          fVar5 = pfVar53[uVar21] * *pfVar47;
          pfVar47 = pfVar47 + (ulong)(~uVar19 >> 0x1f) * 2 + -1;
          auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar26 + lVar41 * 4)),
                                  ZEXT416(*(uint *)(lVar52 + lVar41 * 4)),0x10);
          lVar41 = lVar41 + 1;
          auVar84._0_4_ = fVar5 * auVar54._0_4_;
          auVar84._4_4_ = fVar5 * auVar54._4_4_;
          auVar84._8_4_ = fVar5 * auVar54._8_4_;
          auVar84._12_4_ = fVar5 * auVar54._12_4_;
          auVar54 = vandps_avx(auVar84,auVar73);
          auVar54 = vmovlhps_avx(auVar84,auVar54);
          auVar76._0_4_ = auVar93._0_4_ + auVar54._0_4_;
          auVar76._4_4_ = auVar93._4_4_ + auVar54._4_4_;
          auVar76._8_4_ = auVar93._8_4_ + auVar54._8_4_;
          auVar76._12_4_ = auVar93._12_4_ + auVar54._12_4_;
          auVar93 = ZEXT1664(auVar76);
        } while (lVar41 != 9);
        uVar23 = uVar23 + 0x18;
        uVar21 = uVar21 + (ulong)(-1 < (int)uVar37) * 2 + -1;
        lVar52 = lVar52 + 0x60;
        lVar26 = lVar26 + 0x60;
      } while (uVar23 < uVar37 * 0x18 + 0x198);
      uVar37 = uVar37 + 5;
      uVar43 = uVar43 + 0x78;
      fVar5 = gauss_s2_arr[lVar49];
      auVar15._4_4_ = fVar5;
      auVar15._0_4_ = fVar5;
      auVar15._8_4_ = fVar5;
      auVar15._12_4_ = fVar5;
      auVar57 = vmulps_avx512vl(auVar76,auVar15);
      lVar49 = lVar49 + 1;
      auVar79._0_4_ = auVar57._0_4_ * auVar57._0_4_;
      auVar79._4_4_ = auVar57._4_4_ * auVar57._4_4_;
      auVar79._8_4_ = auVar57._8_4_ * auVar57._8_4_;
      auVar79._12_4_ = auVar57._12_4_ * auVar57._12_4_;
      auVar55 = vshufpd_avx(auVar57,auVar57,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar50) = auVar57;
      lVar50 = lVar50 + 4;
      lVar40 = lVar40 + 0x1e0;
      lVar24 = lVar24 + 0x1e0;
      auVar54 = vmovshdup_avx(auVar79);
      auVar56 = vfmadd231ss_fma(auVar54,auVar57,auVar57);
      auVar54 = vshufps_avx(auVar57,auVar57,0xff);
      auVar55 = vfmadd213ss_fma(auVar55,auVar55,auVar56);
      auVar54 = vfmadd213ss_fma(auVar54,auVar54,auVar55);
      fVar68 = fVar68 + auVar54._0_4_;
    } while ((int)local_100 != (int)lVar49);
    lVar51 = lVar51 + 0x14;
    uVar20 = (ulong)(uVar19 + 5);
  } while ((int)uVar19 < 3);
  if (fVar68 < 0.0) {
    fVar68 = sqrtf(fVar68);
  }
  else {
    auVar54 = vsqrtss_avx(ZEXT416((uint)fVar68),ZEXT416((uint)fVar68));
    fVar68 = auVar54._0_4_;
  }
  lVar51 = 0;
  auVar93 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar68)));
  do {
    auVar66 = vmulps_avx512f(auVar93,*(undefined1 (*) [64])(ipoint->descriptor + lVar51));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar51) = auVar66;
    lVar51 = lVar51 + 0x10;
  } while (lVar51 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_4_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}